

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O3

UChar __thiscall
icu_63::FCDUIterCollationIterator::handleGetTrailSurrogate(FCDUIterCollationIterator *this)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  char16_t *pcVar4;
  uint uVar5;
  
  if ((int)this->state < 3) {
    uVar3 = (*(code *)((this->super_UIterCollationIterator).iter)->next)();
    if ((uVar3 & 0xfffffc00) == 0xdc00) {
      if (this->state == ITER_IN_FCD_SEGMENT) {
        this->pos = this->pos + 1;
      }
    }
    else if (-1 < (int)uVar3) {
      (*(code *)((this->super_UIterCollationIterator).iter)->previous)();
    }
  }
  else {
    uVar2 = this->pos;
    sVar1 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar5 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      uVar5 = (int)sVar1 >> 5;
    }
    uVar3 = 0xffff;
    if (uVar2 < uVar5) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar4 = (this->normalized).fUnion.fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&(this->normalized).fUnion + 2);
      }
      uVar3 = (uint)(ushort)pcVar4[(int)uVar2];
      if ((pcVar4[(int)uVar2] & 0xfc00U) == 0xdc00) {
        this->pos = uVar2 + 1;
      }
    }
  }
  return (UChar)uVar3;
}

Assistant:

UChar
FCDUIterCollationIterator::handleGetTrailSurrogate() {
    if(state <= ITER_IN_FCD_SEGMENT) {
        UChar32 trail = iter.next(&iter);
        if(U16_IS_TRAIL(trail)) {
            if(state == ITER_IN_FCD_SEGMENT) { ++pos; }
        } else if(trail >= 0) {
            iter.previous(&iter);
        }
        return (UChar)trail;
    } else {
        U_ASSERT(pos < normalized.length());
        UChar trail;
        if(U16_IS_TRAIL(trail = normalized[pos])) { ++pos; }
        return trail;
    }
}